

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzvec.h
# Opt level: O1

TPZVec<TPZGeoElSide> * __thiscall
TPZVec<TPZGeoElSide>::operator=(TPZVec<TPZGeoElSide> *this,TPZVec<TPZGeoElSide> *rval)

{
  TPZGeoElSide *pTVar1;
  ulong uVar2;
  TPZGeoElSide *pTVar3;
  undefined1 auVar4 [16];
  ulong uVar5;
  ulong uVar6;
  ulong *puVar7;
  long lVar8;
  long lVar9;
  
  if (this != rval) {
    this->fNElements = rval->fNElements;
    pTVar1 = this->fStore;
    if (pTVar1 != (TPZGeoElSide *)0x0) {
      operator_delete__(&pTVar1[-1].fSide,*(long *)&pTVar1[-1].fSide * 0x18 + 8);
    }
    if (rval->fNAlloc == 0) {
      uVar2 = this->fNElements;
      auVar4._8_8_ = 0;
      auVar4._0_8_ = uVar2;
      uVar5 = SUB168(auVar4 * ZEXT816(0x18),0);
      uVar6 = uVar5 + 8;
      if (0xfffffffffffffff7 < uVar5) {
        uVar6 = 0xffffffffffffffff;
      }
      uVar5 = 0xffffffffffffffff;
      if (SUB168(auVar4 * ZEXT816(0x18),8) == 0) {
        uVar5 = uVar6;
      }
      puVar7 = (ulong *)operator_new__(uVar5);
      *puVar7 = uVar2;
      if (uVar2 != 0) {
        lVar9 = 0;
        do {
          *(undefined ***)((long)puVar7 + lVar9 + 8) = &PTR__TPZGeoElSide_01920090;
          *(undefined8 *)((long)puVar7 + lVar9 + 0x10) = 0;
          *(undefined4 *)((long)puVar7 + lVar9 + 0x18) = 0xffffffff;
          lVar9 = lVar9 + 0x18;
        } while (uVar2 * 0x18 != lVar9);
      }
      this->fStore = (TPZGeoElSide *)(puVar7 + 1);
      if (0 < this->fNElements) {
        lVar9 = 8;
        lVar8 = 0;
        do {
          pTVar1 = rval->fStore;
          pTVar3 = this->fStore;
          *(undefined4 *)((long)&pTVar3->fGeoEl + lVar9) =
               *(undefined4 *)((long)&pTVar1->fGeoEl + lVar9);
          *(undefined8 *)((long)&(pTVar3->super_TPZSavable)._vptr_TPZSavable + lVar9) =
               *(undefined8 *)((long)&(pTVar1->super_TPZSavable)._vptr_TPZSavable + lVar9);
          lVar8 = lVar8 + 1;
          lVar9 = lVar9 + 0x18;
        } while (lVar8 < this->fNElements);
      }
    }
    else {
      this->fStore = rval->fStore;
    }
    this->fNAlloc = this->fNElements;
    rval->fStore = (TPZGeoElSide *)0x0;
    rval->fNElements = 0;
    rval->fNAlloc = 0;
  }
  return this;
}

Assistant:

TPZVec<T> &TPZVec<T>::operator=(TPZVec<T> &&rval){
	if(this != &rval){
        fNElements = rval.fNElements;
        if(fStore) delete [] fStore;
        if(rval.fNAlloc){
            fStore = rval.fStore;
        }else{
            fStore = new T[fNElements];
            for (int64_t i = 0; i < fNElements; i++)
                fStore[i] = rval.fStore[i];
        }
        fNAlloc = fNElements;//perhaps rval.fNalloc was 0
        rval.fStore = nullptr;
        rval.fNElements = 0;
        rval.fNAlloc = 0;
	}
	return *this;
}